

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

IfStatement * __thiscall Parser::ifStmt(Parser *this)

{
  int iVar1;
  ExprNode *pEVar2;
  Statements *pSVar3;
  IfStatement *this_00;
  IfStatement *this_01;
  IfStatement *pIVar4;
  undefined8 extraout_RAX;
  Token boolKeyword;
  Token colon;
  undefined1 local_280 [32];
  _Alloc_hider local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  bool local_240;
  bool bStack_23f;
  bool bStack_23e;
  bool bStack_23d;
  bool bStack_23c;
  bool bStack_23b;
  char cStack_23a;
  undefined1 uStack_239;
  double dStack_238;
  _Alloc_hider local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  undefined1 local_210 [32];
  _Alloc_hider local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  bool local_1d0;
  bool bStack_1cf;
  bool bStack_1ce;
  bool bStack_1cd;
  bool bStack_1cc;
  bool bStack_1cb;
  char cStack_1ca;
  undefined1 uStack_1c9;
  double dStack_1c8;
  _Alloc_hider local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  Token local_a0;
  
  Tokenizer::getToken((Token *)local_210,this->tokenizer);
  iVar1 = std::__cxx11::string::compare((char *)local_210);
  if (iVar1 == 0) {
    pEVar2 = exprOrTest(this);
    Tokenizer::getToken(&local_a0,this->tokenizer);
    if (local_a0._symbol == ':') {
      pSVar3 = suite(this);
      this_00 = (IfStatement *)operator_new(0x78);
      IfStatement::IfStatement(this_00,pEVar2,pSVar3);
      Tokenizer::getToken((Token *)local_280,this->tokenizer);
      std::__cxx11::string::operator=((string *)local_210,(string *)local_280);
      std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_260);
      local_1d0 = local_240;
      bStack_1cf = bStack_23f;
      bStack_1ce = bStack_23e;
      bStack_1cd = bStack_23d;
      bStack_1cc = bStack_23c;
      bStack_1cb = bStack_23b;
      cStack_1ca = cStack_23a;
      uStack_1c9 = uStack_239;
      dStack_1c8 = dStack_238;
      std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_p != &local_220) {
        operator_delete(local_230._M_p,local_220._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_p != &local_250) {
        operator_delete(local_260._M_p,local_250._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
        operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
      }
      iVar1 = std::__cxx11::string::compare(local_210);
      this_01 = this_00;
      if (iVar1 == 0) {
        pIVar4 = this_00;
        do {
          pEVar2 = exprOrTest(this);
          Tokenizer::getToken((Token *)local_280,this->tokenizer);
          std::__cxx11::string::operator=((string *)local_210,(string *)local_280);
          std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_260);
          local_1d0 = local_240;
          bStack_1cf = bStack_23f;
          bStack_1ce = bStack_23e;
          bStack_1cd = bStack_23d;
          bStack_1cc = bStack_23c;
          bStack_1cb = bStack_23b;
          cStack_1ca = cStack_23a;
          uStack_1c9 = uStack_239;
          dStack_1c8 = dStack_238;
          std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_p != &local_220) {
            operator_delete(local_230._M_p,local_220._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_p != &local_250) {
            operator_delete(local_260._M_p,local_250._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
            operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
          }
          if (cStack_1ca != ':') {
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_140,"Parser::ifStmt","");
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_160,"Expected a colon, instead got","");
            die(this,&local_140,&local_160,(Token *)local_210);
            goto LAB_00109a29;
          }
          pSVar3 = suite(this);
          this_01 = (IfStatement *)operator_new(0x78);
          IfStatement::IfStatement(this_01,pEVar2,pSVar3);
          IfStatement::setElif(pIVar4,this_01);
          Tokenizer::getToken((Token *)local_280,this->tokenizer);
          std::__cxx11::string::operator=((string *)local_210,(string *)local_280);
          std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_260);
          local_1d0 = local_240;
          bStack_1cf = bStack_23f;
          bStack_1ce = bStack_23e;
          bStack_1cd = bStack_23d;
          bStack_1cc = bStack_23c;
          bStack_1cb = bStack_23b;
          cStack_1ca = cStack_23a;
          uStack_1c9 = uStack_239;
          dStack_1c8 = dStack_238;
          std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_p != &local_220) {
            operator_delete(local_230._M_p,local_220._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_p != &local_250) {
            operator_delete(local_260._M_p,local_250._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
            operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
          }
          iVar1 = std::__cxx11::string::compare(local_210);
          pIVar4 = this_01;
        } while (iVar1 == 0);
      }
      iVar1 = std::__cxx11::string::compare(local_210);
      if (iVar1 != 0) {
        Tokenizer::ungetToken(this->tokenizer);
LAB_001098e3:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._string._M_dataplus._M_p != &local_a0._string.field_2) {
          operator_delete(local_a0._string._M_dataplus._M_p,
                          local_a0._string.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._relOp._M_dataplus._M_p != &local_a0._relOp.field_2) {
          operator_delete(local_a0._relOp._M_dataplus._M_p,
                          local_a0._relOp.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._name._M_dataplus._M_p != &local_a0._name.field_2) {
          operator_delete(local_a0._name._M_dataplus._M_p,
                          local_a0._name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_p != &local_1b0) {
          operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_p != &local_1e0) {
          operator_delete(local_1f0._M_p,local_1e0._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
          operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
        }
        return this_00;
      }
      Tokenizer::getToken((Token *)local_280,this->tokenizer);
      std::__cxx11::string::operator=((string *)local_210,(string *)local_280);
      std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_260);
      local_1d0 = local_240;
      bStack_1cf = bStack_23f;
      bStack_1ce = bStack_23e;
      bStack_1cd = bStack_23d;
      bStack_1cc = bStack_23c;
      bStack_1cb = bStack_23b;
      cStack_1ca = cStack_23a;
      uStack_1c9 = uStack_239;
      dStack_1c8 = dStack_238;
      std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_p != &local_220) {
        operator_delete(local_230._M_p,local_220._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_p != &local_250) {
        operator_delete(local_260._M_p,local_250._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
        operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
      }
      if (cStack_1ca == ':') {
        pSVar3 = suite(this);
        pIVar4 = (IfStatement *)operator_new(0x78);
        IfStatement::IfStatement(pIVar4,(ExprNode *)0x0,pSVar3);
        IfStatement::setElif(this_01,pIVar4);
        goto LAB_001098e3;
      }
      goto LAB_00109b02;
    }
  }
  else {
LAB_00109a29:
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Parser::ifStmt","");
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"Expected an \'if\' token, instead got","");
    die(this,&local_c0,&local_e0,(Token *)local_210);
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Parser::ifStmt","");
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,"Expected a colon, instead got","");
  die(this,&local_100,&local_120,&local_a0);
LAB_00109b02:
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"Parser::ifStmt","");
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a0,"Expected a colon, instead got","");
  die(this,&local_180,&local_1a0,(Token *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  Token::~Token(&local_a0);
  Token::~Token((Token *)local_210);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

IfStatement *Parser::ifStmt() {
    std::vector<std::pair<ExprNode*, Statements*>>totalTestSuites;
    Token boolKeyword = tokenizer.getToken();
    if (!boolKeyword.isIf())
        die("Parser::ifStmt", "Expected an 'if' token, instead got", boolKeyword);
    ExprNode *ifConditionTest = test();

    Token colon = tokenizer.getToken();
    if(!colon.isColon())
        die("Parser::ifStmt", "Expected a colon, instead got", colon);
    Statements* stmts = suite();

    auto *ifStmt = new IfStatement(ifConditionTest, stmts);
    boolKeyword = tokenizer.getToken();
    IfStatement* prevIf = ifStmt;
    while (boolKeyword.isElif()) {
        ifConditionTest = test();
        boolKeyword = tokenizer.getToken();
        if (!boolKeyword.isColon())
            die("Parser::ifStmt", "Expected a colon, instead got", boolKeyword);
        stmts = suite();
        auto *elif = new IfStatement(ifConditionTest, stmts);
        prevIf->setElif(elif);
        prevIf = elif;
        boolKeyword = tokenizer.getToken();
    }
    if(boolKeyword.isElse()){
        boolKeyword = tokenizer.getToken();
        if (!boolKeyword.isColon())
            die("Parser::ifStmt", "Expected a colon, instead got", boolKeyword);
        stmts = suite();
        auto *elseStmt = new IfStatement(nullptr, stmts);
        prevIf->setElif(elseStmt);
    } else
        tokenizer.ungetToken();
    return ifStmt;

}